

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

wchar_t div_u16n(uint16_t *q,uint16_t *r,uint16_t *w,uint16_t *num,uint16_t *den,size_t nq,size_t n,
                size_t nd)

{
  _Bool _Var1;
  wchar_t wVar2;
  byte local_a0;
  size_t local_98;
  size_t local_90;
  wchar_t c;
  uint uStack_78;
  _Bool over;
  uint16_t try;
  ushort uStack_72;
  _Bool redo_w;
  uint32_t hi;
  uint16_t lo;
  size_t iqrb;
  size_t iqr;
  size_t ir;
  size_t nqu;
  size_t msb_r;
  size_t msb_d;
  size_t nq_local;
  uint16_t *den_local;
  uint16_t *num_local;
  uint16_t *w_local;
  uint16_t *r_local;
  uint16_t *q_local;
  
  msb_d = nq;
  nq_local = (size_t)den;
  den_local = num;
  num_local = w;
  w_local = r;
  r_local = q;
  msb_r = msb_u16n(den,nd);
  if (msb_r == 0) {
    q_local._4_4_ = L'\x02';
  }
  else {
    nqu = msb_u16n(den_local,n);
    if (msb_r < nqu) {
      ir = (nqu - msb_r) + 0xf >> 4;
    }
    else {
      ir = 1;
    }
    for (iqr = 0; iqr < n; iqr = iqr + 1) {
      w_local[iqr] = den_local[iqr];
    }
    if (msb_d < ir) {
      local_90 = ir;
    }
    else {
      local_90 = msb_d;
    }
    iqrb = local_90;
    if (msb_d < ir) {
      local_98 = ir;
    }
    else {
      local_98 = msb_d;
    }
    _hi = local_98 << 4;
    for (; iqrb != 0; iqrb = iqrb - 1) {
      if (nqu < (msb_r + _hi) - 0x10) {
        if (iqrb <= msb_d) {
          r_local[msb_d - iqrb] = 0;
        }
      }
      else {
        uStack_72 = 0;
        if (((nqu - msb_r) + 1) - (_hi + -0x10) < 0x10) {
          local_a0 = (((char)nqu - (char)msb_r) + '\x01') - ((char)_hi + -0x10);
        }
        else {
          local_a0 = 0x10;
        }
        uStack_78 = 1 << (local_a0 & 0x1f);
        c._3_1_ = true;
        if (uStack_78 == 1) {
          __assert_fail("lo < hi - 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x541,
                        "int div_u16n(uint16_t *, uint16_t *, uint16_t *, const uint16_t *, const uint16_t *, size_t, size_t, size_t)"
                       );
        }
        do {
          c._0_2_ = (ushort)(uStack_72 + uStack_78 >> 1);
          _Var1 = mul_u16n(num_local,(uint16_t *)nq_local,(uint16_t *)&c,nd + 1,nd,1);
          if (_Var1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x548,
                          "int div_u16n(uint16_t *, uint16_t *, uint16_t *, const uint16_t *, const uint16_t *, size_t, size_t, size_t)"
                         );
          }
          wVar2 = cmp_u16n(w_local,num_local,n - (iqrb - 1),nd + 1);
          if (L'\xffffffff' < wVar2) {
            uStack_72 = (ushort)c;
          }
          else {
            uStack_78 = (uint)(ushort)c;
          }
          c._3_1_ = L'\xffffffff' >= wVar2;
        } while ((wVar2 != L'\0') && ((uint)uStack_72 != uStack_78 - 1));
        if ((bool)c._3_1_) {
          _Var1 = mul_u16n(num_local,(uint16_t *)nq_local,&stack0xffffffffffffff8e,nd + 1,nd,1);
          if (_Var1) {
            __assert_fail("!over",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x556,
                          "int div_u16n(uint16_t *, uint16_t *, uint16_t *, const uint16_t *, const uint16_t *, size_t, size_t, size_t)"
                         );
          }
          wVar2 = cmp_u16n(w_local,num_local,n - (iqrb - 1),nd + 1);
          if (wVar2 < L'\0') {
            __assert_fail("cmp_u16n(r, w, n - (iqr - 1), nd + 1) >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x558,
                          "int div_u16n(uint16_t *, uint16_t *, uint16_t *, const uint16_t *, const uint16_t *, size_t, size_t, size_t)"
                         );
          }
        }
        if (iqrb <= msb_d) {
          r_local[msb_d - iqrb] = uStack_72;
        }
        subip_u16n(w_local,num_local,n - (iqrb - 1),nd + 1);
        nqu = msb_u16n(w_local,n);
      }
      _hi = _hi + -0x10;
    }
    q_local._4_4_ = (wchar_t)(msb_d < ir);
  }
  return q_local._4_4_;
}

Assistant:

static int div_u16n(uint16_t *q, uint16_t *r, uint16_t *w, const uint16_t *num,
		const uint16_t *den, size_t nq, size_t n, size_t nd)
{
	size_t msb_d = msb_u16n(den, nd), msb_r;
	size_t nqu, ir, iqr, iqrb;

	if (msb_d == 0) {
		return 2;
	}
	msb_r = msb_u16n(num, n);
	if (msb_r > msb_d) {
		nqu = ((msb_r - msb_d) + 15) / 16;
	} else {
		nqu = 1;
	}

	for (ir = 0; ir < n; ++ir) {
		r[ir] = num[ir];
	}

	for (iqr = MAX(nq, nqu), iqrb = MAX(nq, nqu) * 16; iqr > 0;
			--iqr, iqrb -= 16) {
		uint16_t lo;
		uint32_t hi;
		bool redo_w;

		if (msb_d + iqrb - 16 > msb_r) {
			if (iqr <= nq) {
				q[nq - iqr] = 0;
			}
			continue;
		}
		/* Use binary search to determine the digit in the quotient. */
		lo = 0;
		hi = (uint32_t)1 << MIN(16, (msb_r - msb_d  + 1 - (iqrb - 16)));
		redo_w = true;
		assert (lo < hi - 1);
		while (1) {
			uint16_t try = (uint16_t)((lo + hi) / 2);
			bool over = mul_u16n(w, den, &try, nd + 1, nd, 1);
			int c;

			if (over) {
				assert(0);
			}
			c = cmp_u16n(r, w, n - (iqr - 1), nd + 1);
			if (c < 0) {
				hi = try;
				redo_w = true;
			} else {
				lo = try;
				redo_w = false;
			}
			if (!c || lo == hi - 1) {
				if (redo_w) {
					over = mul_u16n(w, den, &lo, nd + 1,
						nd, 1);
					assert(!over);
					assert(cmp_u16n(r, w, n - (iqr - 1),
						nd + 1) >= 0);
				}
				if (iqr <= nq) {
					q[nq - iqr] = lo;
				}
				subip_u16n(r, w, n - (iqr - 1), nd + 1);
				msb_r = msb_u16n(r, n);
				break;
			}
		}
	}
	return (nqu > nq) ? 1 : 0;
}